

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void DumpHeader(DumpState *D)

{
  DumpState *D_local;
  
  DumpBlock("\x1bRavi",5,D);
  DumpByte(0x53,D);
  DumpByte(1,D);
  DumpBlock(anon_var_dwarf_1578f,6,D);
  DumpByte(4,D);
  DumpByte(8,D);
  DumpByte(4,D);
  DumpByte(8,D);
  DumpByte(8,D);
  DumpInteger(0x5678,D);
  DumpNumber(370.5,D);
  return;
}

Assistant:

static void DumpHeader (DumpState *D) {
  DumpLiteral(LUA_SIGNATURE, D);
  DumpByte(LUAC_VERSION, D);
  DumpByte(LUAC_FORMAT, D);
  DumpLiteral(LUAC_DATA, D);
  DumpByte(sizeof(int), D);
  DumpByte(sizeof(size_t), D);
  DumpByte(sizeof(Instruction), D);
  DumpByte(sizeof(lua_Integer), D);
  DumpByte(sizeof(lua_Number), D);
  DumpInteger(LUAC_INT, D);
  DumpNumber(LUAC_NUM, D);
}